

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

QRect __thiscall QTreeWidget::visualItemRect(QTreeWidget *this,QTreeWidgetItem *item)

{
  QRect QVar1;
  int arow;
  QTreeWidgetPrivate *__s;
  QHeaderView *this_00;
  int in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  int lastVisibleSection;
  int firstVisiblesection;
  QTreeWidgetPrivate *d;
  QModelIndex last;
  QModelIndex first;
  QModelIndex base;
  QTreeView *in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  QModelIndex *this_01;
  undefined1 local_88 [16];
  QRect local_78;
  undefined1 *local_68;
  undefined1 *puStack_60;
  QModelIndex *local_58;
  undefined1 *local_48;
  undefined1 *puStack_40;
  QModelIndex *local_38;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __s = d_func((QTreeWidget *)0x918255);
  this_01 = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  QTreeWidgetPrivate::index((QTreeWidgetPrivate *)&local_28,(char *)__s,in_ESI);
  QTreeView::header(in_stack_ffffffffffffff00);
  QTreeView::header(in_stack_ffffffffffffff00);
  QHeaderView::offset((QHeaderView *)in_stack_ffffffffffffff00);
  QHeaderView::logicalIndexAt
            ((QHeaderView *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
             (int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  this_00 = QTreeView::header(in_stack_ffffffffffffff00);
  QTreeView::header((QTreeView *)this_00);
  arow = QHeaderView::length(this_00);
  QTreeView::header((QTreeView *)this_00);
  QHeaderView::offset(this_00);
  QHeaderView::logicalIndexAt
            ((QHeaderView *)CONCAT44(arow,in_stack_ffffffffffffff08),(int)((ulong)this_00 >> 0x20));
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = this_01;
  QModelIndex::row((QModelIndex *)&local_28);
  QModelIndex::sibling(this_01,arow,in_stack_ffffffffffffff08);
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = this_01;
  QModelIndex::row((QModelIndex *)&local_28);
  QModelIndex::sibling(this_01,arow,in_stack_ffffffffffffff08);
  local_78 = (QRect)(**(code **)(*in_RDI + 0x1e0))(in_RDI,&local_48);
  local_88 = (**(code **)(*in_RDI + 0x1e0))(in_RDI,&local_68);
  QVar1 = (QRect)QRect::operator|(&local_78,(QRect *)local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

QRect QTreeWidget::visualItemRect(const QTreeWidgetItem *item) const
{
    Q_D(const QTreeWidget);
    //the visual rect for an item is across all columns. So we need to determine
    //what is the first and last column and get their visual index rects
    const QModelIndex base = d->index(item);
    const int firstVisiblesection = header()->logicalIndexAt(- header()->offset());
    const int lastVisibleSection = header()->logicalIndexAt(header()->length() - header()->offset() - 1);
    const QModelIndex first = base.sibling(base.row(), firstVisiblesection);
    const QModelIndex last = base.sibling(base.row(), lastVisibleSection);
    return visualRect(first) | visualRect(last);
}